

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void verifyOrthonormal<Imath_3_2::Matrix44<float>>(Matrix44<float> *A,BaseType_conflict2 threshold)

{
  uint __line;
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  char *__assertion;
  undefined1 auStack_a8 [12];
  BaseType_conflict2 local_9c;
  Matrix44<float> prod;
  Matrix44<float> local_58;
  
  puVar3 = auStack_a8;
  local_9c = threshold;
  Imath_3_2::Matrix44<float>::transposed(A);
  Imath_3_2::Matrix44<float>::multiply(A,&local_58);
  lVar1 = 0;
  do {
    puVar3 = puVar3 + 0x10;
    if (lVar1 == 4) {
      return;
    }
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      if (lVar1 == lVar2) {
        if (local_9c <= ABS(*(float *)((long)prod.x + lVar1 * 0x14) + -1.0)) {
          __assertion = "std::abs (prod[i][j] - 1) < threshold";
          __line = 0x3c;
LAB_0012ee33:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,__line,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix44<float>]"
                       );
        }
      }
      else if (local_9c <= ABS(*(float *)(puVar3 + lVar2 * 4))) {
        __assertion = "std::abs (prod[i][j]) < threshold";
        __line = 0x3e;
        goto LAB_0012ee33;
      }
    }
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const TM& A, const typename TM::BaseType threshold)
{
    const TM prod = A * A.transposed ();
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < threshold);
            else
                assert (std::abs (prod[i][j]) < threshold);
}